

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O2

void __thiscall google::protobuf::DynamicMessage::~DynamicMessage(DynamicMessage *this)

{
  uint uVar1;
  int iVar2;
  Descriptor *this_00;
  Cord *this_01;
  DynamicMessage *pDVar3;
  long *plVar4;
  bool bVar5;
  CppStringType CVar6;
  FieldDescriptor *field;
  OneofDescriptor *pOVar7;
  DynamicMapField *this_02;
  long lVar8;
  int i;
  
  this_00 = (this->type_info_->class_data).descriptor;
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  lVar8 = (long)this->type_info_->extensions_offset;
  if (lVar8 != -1) {
    internal::ExtensionSet::~ExtensionSet
              ((ExtensionSet *)
               ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite + lVar8));
  }
  lVar8 = 0;
  do {
    if (this_00->field_count_ <= lVar8) {
      return;
    }
    field = Descriptor::field(this_00,(int)lVar8);
    bVar5 = anon_unknown_0::InRealOneof(field);
    if (bVar5) {
      pOVar7 = FieldDescriptor::containing_oneof(field);
      if (*(int *)((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                  (long)((int)(((long)pOVar7 - (long)pOVar7->containing_type_->oneof_decls_) / 0x38)
                         * 4 + this->type_info_->oneof_case_offset)) == field->number_) {
        this_02 = (DynamicMapField *)MutableOneofFieldRaw(this,field);
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10) {
LAB_00232770:
          plVar4 = (long *)(this_02->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i;
          if (plVar4 != (long *)0x0) {
            (**(code **)(*plVar4 + 8))();
          }
        }
        else if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 9) {
          CVar6 = FieldDescriptor::cpp_string_type(field);
          if ((CVar6 == kView) || (CVar6 == kString)) {
LAB_00232788:
            internal::ArenaStringPtr::Destroy((ArenaStringPtr *)this_02);
          }
          else if (CVar6 == kCord) {
            this_01 = (Cord *)(this_02->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i
            ;
            if (this_01 != (Cord *)0x0) {
              absl::lts_20250127::Cord::~Cord(this_01);
            }
            operator_delete(this_01,0x10);
          }
        }
      }
    }
    else {
      uVar1 = (this->type_info_->offsets)._M_t.
              super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
              super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar8];
      bVar5 = FieldDescriptor::is_repeated(field);
      this_02 = (DynamicMapField *)
                ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite + (long)(int)uVar1
                );
      iVar2 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4);
      if (bVar5) {
        switch(iVar2) {
        case 1:
        case 8:
          RepeatedField<int>::~RepeatedField((RepeatedField<int> *)this_02);
          break;
        case 2:
          RepeatedField<long>::~RepeatedField((RepeatedField<long> *)this_02);
          break;
        case 3:
          RepeatedField<unsigned_int>::~RepeatedField((RepeatedField<unsigned_int> *)this_02);
          break;
        case 4:
          RepeatedField<unsigned_long>::~RepeatedField((RepeatedField<unsigned_long> *)this_02);
          break;
        case 5:
          RepeatedField<double>::~RepeatedField((RepeatedField<double> *)this_02);
          break;
        case 6:
          RepeatedField<float>::~RepeatedField((RepeatedField<float> *)this_02);
          break;
        case 7:
          RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)this_02);
          break;
        case 9:
          CVar6 = FieldDescriptor::cpp_string_type(field);
          if ((CVar6 == kView) || (CVar6 == kString)) {
            RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)this_02);
          }
          else if (CVar6 == kCord) {
            RepeatedField<absl::lts_20250127::Cord>::~RepeatedField
                      ((RepeatedField<absl::lts_20250127::Cord> *)this_02);
          }
          break;
        case 10:
          bVar5 = FieldDescriptor::is_map(field);
          if (bVar5) {
            internal::DynamicMapField::~DynamicMapField(this_02);
          }
          else {
            RepeatedPtrField<google::protobuf::Message>::~RepeatedPtrField
                      ((RepeatedPtrField<google::protobuf::Message> *)this_02);
          }
        }
      }
      else if (iVar2 == 10) {
        pDVar3 = (DynamicMessage *)(this->type_info_->class_data).super_ClassData.prototype;
        if (pDVar3 != (DynamicMessage *)0x0 && pDVar3 != this) goto LAB_00232770;
      }
      else if (iVar2 == 9) {
        CVar6 = FieldDescriptor::cpp_string_type(field);
        if ((CVar6 == kView) || (CVar6 == kString)) goto LAB_00232788;
        if (CVar6 == kCord) {
          absl::lts_20250127::Cord::~Cord((Cord *)this_02);
        }
      }
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

DynamicMessage::~DynamicMessage() {
  const Descriptor* descriptor = type_info_->class_data.descriptor;

  _internal_metadata_.Delete<UnknownFieldSet>();

  if (type_info_->extensions_offset != -1) {
    reinterpret_cast<ExtensionSet*>(MutableExtensionsRaw())->~ExtensionSet();
  }

  // We need to manually run the destructors for repeated fields and strings,
  // just as we ran their constructors in the DynamicMessage constructor.
  // We also need to manually delete oneof fields if it is set and is string
  // or message.
  // Additionally, if any singular embedded messages have been allocated, we
  // need to delete them, UNLESS we are the prototype message of this type,
  // in which case any embedded messages are other prototypes and shouldn't
  // be touched.
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    if (InRealOneof(field)) {
      void* field_ptr = MutableOneofCaseRaw(field->containing_oneof()->index());
      if (*(reinterpret_cast<const int32_t*>(field_ptr)) == field->number()) {
        field_ptr = MutableOneofFieldRaw(field);
        if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
          switch (field->cpp_string_type()) {
            case FieldDescriptor::CppStringType::kCord:
              delete *reinterpret_cast<absl::Cord**>(field_ptr);
              break;
            case FieldDescriptor::CppStringType::kView:
              if (internal::EnableExperimentalMicroString()) {
                reinterpret_cast<MicroString*>(field_ptr)->Destroy();
                break;
              }
              [[fallthrough]];
            case FieldDescriptor::CppStringType::kString: {
              reinterpret_cast<ArenaStringPtr*>(field_ptr)->Destroy();
              break;
            }
          }
        } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            delete *reinterpret_cast<Message**>(field_ptr);
        }
      }
      continue;
    }
    void* field_ptr = MutableRaw(i);

    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                  \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:               \
    reinterpret_cast<RepeatedField<LOWERCASE>*>(field_ptr) \
        ->~RepeatedField<LOWERCASE>();                     \
    break

        HANDLE_TYPE(INT32, int32_t);
        HANDLE_TYPE(INT64, int64_t);
        HANDLE_TYPE(UINT32, uint32_t);
        HANDLE_TYPE(UINT64, uint64_t);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE(FLOAT, float);
        HANDLE_TYPE(BOOL, bool);
        HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->cpp_string_type()) {
            case FieldDescriptor::CppStringType::kCord:
              reinterpret_cast<RepeatedField<absl::Cord>*>(field_ptr)
                  ->~RepeatedField<absl::Cord>();
              break;
            case FieldDescriptor::CppStringType::kView:
            case FieldDescriptor::CppStringType::kString:
              reinterpret_cast<RepeatedPtrField<std::string>*>(field_ptr)
                  ->~RepeatedPtrField<std::string>();
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (IsMapFieldInApi(field)) {
            reinterpret_cast<DynamicMapField*>(field_ptr)->~DynamicMapField();
          } else {
            reinterpret_cast<RepeatedPtrField<Message>*>(field_ptr)
                ->~RepeatedPtrField<Message>();
          }
          break;
      }

    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
      switch (field->cpp_string_type()) {
        case FieldDescriptor::CppStringType::kCord:
          reinterpret_cast<absl::Cord*>(field_ptr)->~Cord();
          break;
        case FieldDescriptor::CppStringType::kView:
          if (internal::EnableExperimentalMicroString()) {
            MutableRaw<MicroString>(i)->Destroy();
            break;
          }
          [[fallthrough]];
        case FieldDescriptor::CppStringType::kString: {
          reinterpret_cast<ArenaStringPtr*>(field_ptr)->Destroy();
          break;
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          if (!is_prototype()) {
        Message* message = *reinterpret_cast<Message**>(field_ptr);
        if (message != nullptr) {
          delete message;
        }
      }
    }
  }
}